

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::
ParameterizedTestFactory<bssl::(anonymous_namespace)::SSLVersionTest_SessionPropertiesThreads_Test>
::CreateTest(ParameterizedTestFactory<bssl::(anonymous_namespace)::SSLVersionTest_SessionPropertiesThreads_Test>
             *this)

{
  Test *this_00;
  ParameterizedTestFactory<bssl::(anonymous_namespace)::SSLVersionTest_SessionPropertiesThreads_Test>
  *this_local;
  
  WithParamInterface<bssl::(anonymous_namespace)::VersionParam>::SetParam(&this->parameter_);
  this_00 = (Test *)operator_new(0x50);
  bssl::anon_unknown_0::SSLVersionTest_SessionPropertiesThreads_Test::
  SSLVersionTest_SessionPropertiesThreads_Test
            ((SSLVersionTest_SessionPropertiesThreads_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }